

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateSerializeWithCachedSizes
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *text;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (this->$name$_size() > 0) {\n  ::google::protobuf::internal::WireFormatLite::WriteTag(\n    $number$,\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n    output);\n  output->WriteVarint32(_$name$_cached_byte_size_);\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  text = 
  "  ::google::protobuf::internal::WireFormatLite::WriteEnum(\n    $number$, this->$name$(i), output);\n"
  ;
  if (bVar1) {
    text = 
    "  ::google::protobuf::internal::WireFormatLite::WriteEnumNoTag(\n    this->$name$(i), output);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) const {
  if (descriptor_->is_packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  ::google::protobuf::internal::WireFormatLite::WriteTag(\n"
      "    $number$,\n"
      "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n"
      "    output);\n"
      "  output->WriteVarint32(_$name$_cached_byte_size_);\n"
      "}\n");
  }
  printer->Print(variables_,
      "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
  if (descriptor_->is_packed()) {
    printer->Print(variables_,
      "  ::google::protobuf::internal::WireFormatLite::WriteEnumNoTag(\n"
      "    this->$name$(i), output);\n");
  } else {
    printer->Print(variables_,
      "  ::google::protobuf::internal::WireFormatLite::WriteEnum(\n"
      "    $number$, this->$name$(i), output);\n");
  }
  printer->Print("}\n");
}